

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_SetUserVarFloat
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  DObject *self_00;
  bool bVar1;
  bool local_57;
  FName local_54;
  PField *local_50;
  PField *var;
  double value;
  DObject *pDStack_38;
  FName varname;
  DObject *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1311,
                  "int AF_AActor_A_SetUserVarFloat(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar1 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar1 = true, (param->field_0).field_1.atag != 1)) {
    bVar1 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar1) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1311,
                  "int AF_AActor_A_SetUserVarFloat(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  pDStack_38 = (DObject *)(param->field_0).field_1.a;
  local_57 = true;
  if (pDStack_38 != (DObject *)0x0) {
    local_57 = DObject::IsKindOf(pDStack_38,DObject::RegistrationInfo.MyClass);
  }
  if (local_57 == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(DObject))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1311,
                  "int AF_AActor_A_SetUserVarFloat(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1312,
                  "int AF_AActor_A_SetUserVarFloat(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[1].field_0.field_3.Type != '\0') {
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1312,
                  "int AF_AActor_A_SetUserVarFloat(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  FName::FName((FName *)((long)&value + 4),param[1].field_0.i);
  self_00 = pDStack_38;
  if (numparam < 3) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1313,
                  "int AF_AActor_A_SetUserVarFloat(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[2].field_0.field_3.Type != '\x01') {
    __assert_fail("param[paramnum].Type == REGT_FLOAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1313,
                  "int AF_AActor_A_SetUserVarFloat(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  var = (PField *)param[2].field_0.field_1.a;
  FName::FName(&local_54,(FName *)((long)&value + 4));
  local_50 = GetVar(self_00,&local_54);
  if (local_50 != (PField *)0x0) {
    (*(local_50->Type->super_PTypeBase).super_DObject._vptr_DObject[0x10])
              (var,local_50->Type,(long)&pDStack_38->_vptr_DObject + local_50->Offset);
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SetUserVarFloat)
{
	PARAM_SELF_PROLOGUE(DObject);
	PARAM_NAME	(varname);
	PARAM_FLOAT	(value);

	// Set the value of the specified user variable.
	PField *var = GetVar(self, varname);
	if (var != nullptr)
	{
		var->Type->SetValue(reinterpret_cast<BYTE *>(self) + var->Offset, value);
	}
	return 0;
}